

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O2

void __thiscall spdlog::details::q_formatter::format(q_formatter *this,log_msg *msg,tm *param_2)

{
  BasicStringRef<char> local_30 [2];
  
  os::thread_name_abi_cxx11_();
  fmt::BasicWriter<char>::operator<<(&(msg->formatted).super_BasicWriter<char>,local_30[0]);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void format(details::log_msg &msg, const std::tm &) override
    {	
        msg.formatted << os::thread_name();
    }